

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O1

uint16_t __thiscall ProtocolTCP::NewPort(ProtocolTCP *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (this->NextPort < 0x401) {
    this->NextPort = 0x400;
  }
  iVar1 = *(int *)&this->NextPort + 1;
  this->NextPort = (uint16_t)iVar1;
  iVar2 = 0;
  do {
    iVar3 = iVar2;
    if (*(short *)(&this->field_0x4 + (long)iVar2 * 0x370) == (short)iVar1) {
      iVar1 = iVar1 + 1;
      this->NextPort = (uint16_t)iVar1;
      iVar3 = -1;
    }
    iVar2 = iVar3 + 1;
  } while (iVar3 < 4);
  return this->NextPort;
}

Assistant:

uint16_t ProtocolTCP::NewPort()
{
    int i;

    if (NextPort <= 1024)
    {
        NextPort = 1024;
    }

    NextPort++;

    for (i = 0; i < TCP_MAX_CONNECTIONS; i++)
    {
        if (ConnectionList[i].LocalPort == NextPort)
        {
            NextPort++;
            i = -1;
        }
    }

    return NextPort;
}